

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_ClassArray<ON_3dmConstructionPlane>::Empty(ON_ClassArray<ON_3dmConstructionPlane> *this)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = (long)this->m_count;
  if (0 < lVar1) {
    uVar2 = lVar1 + 1;
    lVar1 = lVar1 * 0xa8;
    do {
      ON_3dmConstructionPlane::~ON_3dmConstructionPlane
                ((ON_3dmConstructionPlane *)((long)&this->m_a[-1].m_plane.origin.x + lVar1));
      memset((void *)((long)&this->m_a[-1].m_plane.origin.x + lVar1),0,0xa8);
      ON_3dmConstructionPlane::ON_3dmConstructionPlane
                ((ON_3dmConstructionPlane *)((long)&this->m_a[-1].m_plane.origin.x + lVar1));
      uVar2 = uVar2 - 1;
      lVar1 = lVar1 + -0xa8;
    } while (1 < uVar2);
  }
  this->m_count = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}